

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderRenderDerivateTests.cpp
# Opt level: O1

int __thiscall
vkt::sr::anon_unknown_0::LinearDerivateCaseInstance::verify
          (LinearDerivateCaseInstance *this,EVP_PKEY_CTX *ctx,uchar *sig,size_t siglen,uchar *tbs,
          size_t tbslen)

{
  ostringstream *poVar1;
  float fVar2;
  int iVar3;
  Precision precision;
  DerivateCaseValues *pDVar4;
  DerivateCaseDefinition *pDVar5;
  Vec4 *pVVar6;
  ulong uVar7;
  bool bVar8;
  int i;
  int i_6;
  DataType DVar9;
  int iVar10;
  long lVar11;
  undefined7 extraout_var;
  undefined8 uVar12;
  undefined7 extraout_var_00;
  EVP_PKEY_CTX *pEVar13;
  long lVar14;
  long lVar15;
  MessageBuilder *this_00;
  uint uVar16;
  undefined4 uVar17;
  float fVar18;
  Vector<float,_3> res_11;
  float fStack_25c;
  Vec4 reference;
  Vector<float,_2> res_6;
  Vec4 threshold;
  Vector<float,_4> res;
  float local_214 [3];
  Vec4 opThreshold;
  Vec4 surfaceThreshold;
  Vec4 yScale;
  Vec4 xScale;
  Vector<float,_4> res_2;
  ios_base local_140 [272];
  
  uVar7 = stack0xfffffffffffffda0;
  xScale.m_data[0] = 1.0;
  xScale.m_data[1] = 0.0;
  xScale.m_data[2] = 0.5;
  xScale.m_data[3] = -0.5;
  yScale.m_data[0] = 0.0;
  yScale.m_data[1] = 1.0;
  yScale.m_data[2] = 0.5;
  yScale.m_data[3] = -0.5;
  TriangleDerivateCaseInstance::getSurfaceThreshold(&this->super_TriangleDerivateCaseInstance);
  pDVar4 = (this->super_TriangleDerivateCaseInstance).m_values;
  res.m_data[0] = 0.0;
  res.m_data[1] = 0.0;
  res.m_data[2] = 0.0;
  res.m_data[3] = 0.0;
  lVar11 = 0;
  do {
    fVar2 = (pDVar4->derivScale).m_data[lVar11];
    fVar18 = -fVar2;
    if (-fVar2 <= fVar2) {
      fVar18 = fVar2;
    }
    res.m_data[lVar11] = fVar18;
    lVar11 = lVar11 + 1;
  } while (lVar11 != 4);
  surfaceThreshold.m_data[0] = 0.0;
  surfaceThreshold.m_data[1] = 0.0;
  surfaceThreshold.m_data[2] = 0.0;
  surfaceThreshold.m_data[3] = 0.0;
  lVar11 = 0;
  do {
    surfaceThreshold.m_data[lVar11] = res_2.m_data[lVar11] / res.m_data[lVar11];
    lVar11 = lVar11 + 1;
  } while (lVar11 != 4);
  pDVar5 = (this->super_TriangleDerivateCaseInstance).m_definitions;
  if (pDVar5->func < DERIVATE_FWIDTH) {
    pEVar13 = ctx + 0xc;
    pVVar6 = &yScale;
    if (pDVar5->func < DERIVATE_DFDY) {
      pEVar13 = ctx + 8;
      pVVar6 = &xScale;
    }
    iVar10 = *(int *)pEVar13;
    res.m_data._0_8_ = *(undefined8 *)pVVar6->m_data;
    res.m_data._8_8_ = *(undefined8 *)(pVVar6->m_data + 2);
    res_2.m_data[0] = 0.0;
    res_2.m_data[1] = 0.0;
    res_2.m_data[2] = 0.0;
    res_2.m_data[3] = 0.0;
    lVar11 = 0;
    do {
      res_2.m_data[lVar11] = (pDVar4->coordMax).m_data[lVar11] - (pDVar4->coordMin).m_data[lVar11];
      lVar11 = lVar11 + 1;
    } while (lVar11 != 4);
    reference.m_data[0] = 0.0;
    reference.m_data[1] = 0.0;
    reference.m_data[2] = 0.0;
    reference.m_data[3] = 0.0;
    lVar11 = 0;
    do {
      reference.m_data[lVar11] = res_2.m_data[lVar11] / (float)iVar10;
      lVar11 = lVar11 + 1;
    } while (lVar11 != 4);
    getDerivateThreshold
              ((anon_unknown_0 *)&opThreshold,pDVar5->precision,&pDVar4->coordMin,&pDVar4->coordMax,
               &reference);
    threshold.m_data[0] = 0.0;
    threshold.m_data[1] = 0.0;
    threshold.m_data[2] = 0.0;
    threshold.m_data[3] = 0.0;
    lVar11 = 0;
    do {
      uVar16 = -(uint)(opThreshold.m_data[lVar11] <= surfaceThreshold.m_data[lVar11]);
      threshold.m_data[lVar11] =
           (float)(~uVar16 & (uint)opThreshold.m_data[lVar11] |
                  (uint)surfaceThreshold.m_data[lVar11] & uVar16);
      lVar11 = lVar11 + 1;
    } while (lVar11 != 4);
    DVar9 = glu::getDataTypeFloatScalars(pDVar5->dataType);
    res_2.m_data[0] = 0.0;
    res_2.m_data[1] = 0.0;
    res_2.m_data[2] = 0.0;
    res_2.m_data[3] = 0.0;
    lVar11 = 0;
    do {
      res_2.m_data[lVar11] = reference.m_data[lVar11] * res.m_data[lVar11];
      lVar11 = lVar11 + 1;
    } while (lVar11 != 4);
    poVar1 = (ostringstream *)(res_2.m_data + 2);
    reference.m_data[0] = res_2.m_data[0];
    reference.m_data[1] = res_2.m_data[1];
    reference.m_data[2] = res_2.m_data[2];
    reference.m_data[3] = res_2.m_data[3];
    res_2.m_data._0_8_ =
         ((this->super_TriangleDerivateCaseInstance).super_ShaderRenderCaseInstance.
          super_TestInstance.m_context)->m_testCtx->m_log;
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,"Verifying result image.\n",0x18);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,"\tValid derivative is ",0x15);
    if (DVar9 == TYPE_FLOAT_VEC3) {
      res_6.m_data[0] = reference.m_data[0];
      res_6.m_data[1] = reference.m_data[1];
      tcu::operator<<((ostream *)poVar1,(Vector<float,_3> *)&res_6);
    }
    else if (DVar9 == TYPE_FLOAT_VEC2) {
      res_6.m_data[0] = reference.m_data[0];
      res_6.m_data[1] = reference.m_data[1];
      tcu::operator<<((ostream *)poVar1,&res_6);
    }
    else if (DVar9 == TYPE_FLOAT) {
      std::ostream::_M_insert<double>((double)reference.m_data[0]);
    }
    else {
      tcu::operator<<((ostream *)poVar1,&reference);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1," with threshold ",0x10);
    if (DVar9 == TYPE_FLOAT_VEC3) {
      res_6.m_data[0] = threshold.m_data[0];
      res_6.m_data[1] = threshold.m_data[1];
      tcu::operator<<((ostream *)poVar1,(Vector<float,_3> *)&res_6);
    }
    else if (DVar9 == TYPE_FLOAT_VEC2) {
      res_6.m_data[0] = threshold.m_data[0];
      res_6.m_data[1] = threshold.m_data[1];
      tcu::operator<<((ostream *)poVar1,&res_6);
    }
    else if (DVar9 == TYPE_FLOAT) {
      std::ostream::_M_insert<double>((double)threshold.m_data[0]);
    }
    else {
      tcu::operator<<((ostream *)poVar1,&threshold);
    }
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)&res_2,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    std::ios_base::~ios_base(local_140);
    pDVar4 = (this->super_TriangleDerivateCaseInstance).m_values;
    bVar8 = verifyConstantDerivate
                      (((this->super_TriangleDerivateCaseInstance).super_ShaderRenderCaseInstance.
                        super_TestInstance.m_context)->m_testCtx->m_log,
                       (ConstPixelBufferAccess *)ctx,(PixelBufferAccess *)sig,
                       ((this->super_TriangleDerivateCaseInstance).m_definitions)->dataType,
                       &reference,&threshold,&pDVar4->derivScale,&pDVar4->derivBias,LOG_NOTHING);
    if (bVar8) {
      res_2.m_data._0_8_ =
           ((this->super_TriangleDerivateCaseInstance).super_ShaderRenderCaseInstance.
            super_TestInstance.m_context)->m_testCtx->m_log;
      poVar1 = (ostringstream *)(res_2.m_data + 2);
      std::__cxx11::ostringstream::ostringstream(poVar1);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)poVar1,"No incorrect derivatives found, result valid.",0x2d);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)&res_2,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream(poVar1);
      uVar12 = std::ios_base::~ios_base(local_140);
      iVar10 = (int)CONCAT71((int7)((ulong)uVar12 >> 8),1);
    }
    else {
      res_2.m_data._0_8_ =
           ((this->super_TriangleDerivateCaseInstance).super_ShaderRenderCaseInstance.
            super_TestInstance.m_context)->m_testCtx->m_log;
      poVar1 = (ostringstream *)(res_2.m_data + 2);
      std::__cxx11::ostringstream::ostringstream(poVar1);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)poVar1,
                 "Initial verification failed, verifying image by calculating accurate error bounds for each result pixel.\n"
                 ,0x69);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)poVar1,
                 "\tVerifying each result derivative is within its range of legal result values.",
                 0x4d);
      this_00 = (MessageBuilder *)&res_2;
      tcu::MessageBuilder::operator<<(this_00,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream(poVar1);
      std::ios_base::~ios_base(local_140);
      pDVar4 = (this->super_TriangleDerivateCaseInstance).m_values;
      res_6.m_data[0] = 0.0;
      res_6.m_data[1] = 0.0;
      lVar11 = 0;
      do {
        res_6.m_data[lVar11] = (pDVar4->coordMax).m_data[lVar11] - (pDVar4->coordMin).m_data[lVar11]
        ;
        lVar11 = lVar11 + 1;
      } while (lVar11 != 4);
      res_2.m_data[0] = 0.0;
      res_2.m_data[1] = 0.0;
      res_2.m_data[2] = 0.0;
      res_2.m_data[3] = 0.0;
      lVar11 = 0;
      lVar15 = 0;
      do {
        lVar14 = 0;
        do {
          uVar17 = 0x3f800000;
          if (lVar11 != lVar14) {
            uVar17 = 0;
          }
          *(undefined4 *)((long)&this_00->m_log + lVar14) = uVar17;
          lVar14 = lVar14 + 0x10;
        } while (lVar14 != 0x30);
        lVar15 = lVar15 + 1;
        this_00 = (MessageBuilder *)((long)&this_00->m_log + 4);
        lVar11 = lVar11 + 0x10;
      } while (lVar15 != 4);
      res_11.m_data[1] = 0.0;
      res_11.m_data[0] = res_6.m_data[0] / 99.0;
      res_11.m_data[2] = (pDVar4->coordMin).m_data[0];
      lVar11 = 0;
      do {
        res_2.m_data[lVar11] = *(float *)((long)res_11.m_data + lVar11);
        lVar11 = lVar11 + 4;
      } while (lVar11 != 0xc);
      res_11.m_data._0_8_ = (ulong)(uint)(res_6.m_data[1] / 133.0) << 0x20;
      res_11.m_data[2] = (pDVar4->coordMin).m_data[1];
      lVar11 = 1;
      do {
        res_2.m_data[lVar11] = *(float *)((long)reference.m_data + lVar11 + -0x11);
        lVar11 = lVar11 + 4;
      } while (lVar11 != 0xd);
      fVar2 = (pDVar4->coordMin).m_data[2];
      local_214[0] = 0.0;
      local_214[1] = 0.0;
      local_214[2] = fVar2 + fVar2;
      res_11.m_data[0] = 0.0;
      res_11.m_data[1] = 0.0;
      stack0xfffffffffffffda0 = uVar7 & 0xffffffff00000000;
      lVar11 = 0;
      do {
        res_11.m_data[lVar11] = local_214[lVar11] * 0.5;
        lVar11 = lVar11 + 1;
      } while (lVar11 != 3);
      lVar11 = 2;
      do {
        res_2.m_data[lVar11] = *(float *)((long)reference.m_data + lVar11 + -0x12);
        lVar11 = lVar11 + 4;
      } while (lVar11 != 0xe);
      fVar2 = (pDVar4->coordMax).m_data[3];
      local_214[0] = -0.0;
      local_214[1] = -0.0;
      local_214[2] = fVar2 + fVar2;
      res_11.m_data[0] = 0.0;
      res_11.m_data[1] = 0.0;
      stack0xfffffffffffffda0 = stack0xfffffffffffffda0 & 0xffffffff00000000;
      lVar11 = 0;
      do {
        res_11.m_data[lVar11] = local_214[lVar11] * 0.5;
        lVar11 = lVar11 + 1;
      } while (lVar11 != 3);
      lVar11 = 3;
      do {
        res_2.m_data[lVar11] = *(float *)((long)reference.m_data + lVar11 + -0x13);
        lVar11 = lVar11 + 4;
      } while (lVar11 != 0xf);
      pDVar5 = (this->super_TriangleDerivateCaseInstance).m_definitions;
      bVar8 = reverifyConstantDerivateWithFlushRelaxations
                        (((this->super_TriangleDerivateCaseInstance).super_ShaderRenderCaseInstance.
                          super_TestInstance.m_context)->m_testCtx->m_log,
                         (ConstPixelBufferAccess *)ctx,(PixelBufferAccess *)sig,pDVar5->dataType,
                         pDVar5->precision,&pDVar4->derivScale,&pDVar4->derivBias,&surfaceThreshold,
                         pDVar5->func,(Linear2DFunctionEvaluator *)&res_2);
      iVar10 = (int)CONCAT71(extraout_var_00,bVar8);
    }
  }
  else {
    iVar10 = *(int *)(ctx + 8);
    iVar3 = *(int *)(ctx + 0xc);
    reference.m_data[0] = 0.0;
    reference.m_data[1] = 0.0;
    reference.m_data[2] = 0.0;
    reference.m_data[3] = 0.0;
    lVar11 = 0;
    do {
      reference.m_data[lVar11] =
           (pDVar4->coordMax).m_data[lVar11] - (pDVar4->coordMin).m_data[lVar11];
      lVar11 = lVar11 + 1;
    } while (lVar11 != 4);
    res.m_data[0] = 0.0;
    res.m_data[1] = 0.0;
    res.m_data[2] = 0.0;
    res.m_data[3] = 0.0;
    lVar11 = 0;
    do {
      res.m_data[lVar11] = reference.m_data[lVar11] / (float)iVar10;
      lVar11 = lVar11 + 1;
    } while (lVar11 != 4);
    res_2.m_data[0] = 0.0;
    res_2.m_data[1] = 0.0;
    res_2.m_data[2] = 0.0;
    res_2.m_data[3] = 0.0;
    lVar11 = 0;
    do {
      res_2.m_data[lVar11] = res.m_data[lVar11] * xScale.m_data[lVar11];
      lVar11 = lVar11 + 1;
    } while (lVar11 != 4);
    opThreshold.m_data[0] = 0.0;
    opThreshold.m_data[1] = 0.0;
    opThreshold.m_data[2] = 0.0;
    opThreshold.m_data[3] = 0.0;
    lVar11 = 0;
    do {
      opThreshold.m_data[lVar11] =
           (pDVar4->coordMax).m_data[lVar11] - (pDVar4->coordMin).m_data[lVar11];
      lVar11 = lVar11 + 1;
    } while (lVar11 != 4);
    reference.m_data[0] = 0.0;
    reference.m_data[1] = 0.0;
    reference.m_data[2] = 0.0;
    reference.m_data[3] = 0.0;
    lVar11 = 0;
    do {
      reference.m_data[lVar11] = opThreshold.m_data[lVar11] / (float)iVar3;
      lVar11 = lVar11 + 1;
    } while (lVar11 != 4);
    res.m_data[0] = 0.0;
    res.m_data[1] = 0.0;
    res.m_data[2] = 0.0;
    res.m_data[3] = 0.0;
    lVar11 = 0;
    do {
      res.m_data[lVar11] = reference.m_data[lVar11] * yScale.m_data[lVar11];
      lVar11 = lVar11 + 1;
    } while (lVar11 != 4);
    opThreshold.m_data[0] = 0.0;
    opThreshold.m_data[1] = 0.0;
    opThreshold.m_data[2] = 0.0;
    opThreshold.m_data[3] = 0.0;
    lVar11 = 0;
    do {
      fVar2 = res_2.m_data[lVar11];
      fVar18 = -fVar2;
      if (-fVar2 <= fVar2) {
        fVar18 = fVar2;
      }
      opThreshold.m_data[lVar11] = fVar18;
      lVar11 = lVar11 + 1;
    } while (lVar11 != 4);
    threshold.m_data[0] = 0.0;
    threshold.m_data[1] = 0.0;
    threshold.m_data[2] = 0.0;
    threshold.m_data[3] = 0.0;
    lVar11 = 0;
    do {
      fVar2 = res.m_data[lVar11];
      fVar18 = -fVar2;
      if (-fVar2 <= fVar2) {
        fVar18 = fVar2;
      }
      threshold.m_data[lVar11] = fVar18;
      lVar11 = lVar11 + 1;
    } while (lVar11 != 4);
    reference.m_data[0] = 0.0;
    reference.m_data[1] = 0.0;
    reference.m_data[2] = 0.0;
    reference.m_data[3] = 0.0;
    lVar11 = 0;
    do {
      reference.m_data[lVar11] = opThreshold.m_data[lVar11] + threshold.m_data[lVar11];
      lVar11 = lVar11 + 1;
    } while (lVar11 != 4);
    precision = pDVar5->precision;
    threshold.m_data[0] = 0.0;
    threshold.m_data[1] = 0.0;
    threshold.m_data[2] = 0.0;
    threshold.m_data[3] = 0.0;
    lVar11 = 0;
    do {
      threshold.m_data[lVar11] = (pDVar4->coordMin).m_data[lVar11] * xScale.m_data[lVar11];
      lVar11 = lVar11 + 1;
    } while (lVar11 != 4);
    res_6.m_data[0] = 0.0;
    res_6.m_data[1] = 0.0;
    lVar11 = 0;
    do {
      res_6.m_data[lVar11] = (pDVar4->coordMax).m_data[lVar11] * xScale.m_data[lVar11];
      lVar11 = lVar11 + 1;
    } while (lVar11 != 4);
    getDerivateThreshold((anon_unknown_0 *)&opThreshold,precision,&threshold,(Vec4 *)&res_6,&res_2);
    res_6.m_data[0] = 0.0;
    res_6.m_data[1] = 0.0;
    lVar11 = 0;
    do {
      res_6.m_data[lVar11] = (pDVar4->coordMin).m_data[lVar11] * yScale.m_data[lVar11];
      lVar11 = lVar11 + 1;
    } while (lVar11 != 4);
    res_11.m_data[0] = 0.0;
    res_11.m_data[1] = 0.0;
    res_11.m_data[2] = 0.0;
    fStack_25c = 0.0;
    lVar11 = 0;
    do {
      res_11.m_data[lVar11] = (pDVar4->coordMax).m_data[lVar11] * yScale.m_data[lVar11];
      lVar11 = lVar11 + 1;
    } while (lVar11 != 4);
    getDerivateThreshold((anon_unknown_0 *)&threshold,precision,(Vec4 *)&res_6,(Vec4 *)&res_11,&res)
    ;
    res_11.m_data[0] = 0.0;
    res_11.m_data[1] = 0.0;
    res_11.m_data[2] = 0.0;
    fStack_25c = 0.0;
    lVar11 = 0;
    do {
      uVar16 = -(uint)(threshold.m_data[lVar11] <= opThreshold.m_data[lVar11]);
      res_11.m_data[lVar11] =
           (float)(~uVar16 & (uint)threshold.m_data[lVar11] |
                  (uint)opThreshold.m_data[lVar11] & uVar16);
      lVar11 = lVar11 + 1;
    } while (lVar11 != 4);
    res_6.m_data[0] = 0.0;
    res_6.m_data[1] = 0.0;
    lVar11 = 0;
    do {
      uVar16 = -(uint)(res_11.m_data[lVar11] <= surfaceThreshold.m_data[lVar11]);
      res_6.m_data[lVar11] =
           (float)(~uVar16 & (uint)res_11.m_data[lVar11] |
                  (uint)surfaceThreshold.m_data[lVar11] & uVar16);
      lVar11 = lVar11 + 1;
    } while (lVar11 != 4);
    bVar8 = verifyConstantDerivate
                      (((this->super_TriangleDerivateCaseInstance).super_ShaderRenderCaseInstance.
                        super_TestInstance.m_context)->m_testCtx->m_log,
                       (ConstPixelBufferAccess *)ctx,(PixelBufferAccess *)sig,pDVar5->dataType,
                       &reference,(Vec4 *)&res_6,&pDVar4->derivScale,&pDVar4->derivBias,LOG_ALL);
    iVar10 = (int)CONCAT71(extraout_var,bVar8);
  }
  return iVar10;
}

Assistant:

bool LinearDerivateCaseInstance::verify (const tcu::ConstPixelBufferAccess& result, const tcu::PixelBufferAccess& errorMask)
{
	const tcu::Vec4		xScale				= tcu::Vec4(1.0f, 0.0f, 0.5f, -0.5f);
	const tcu::Vec4		yScale				= tcu::Vec4(0.0f, 1.0f, 0.5f, -0.5f);
	const tcu::Vec4		surfaceThreshold	= getSurfaceThreshold() / abs(m_values.derivScale);

	if (isDfdxFunc(m_definitions.func) || isDfdyFunc(m_definitions.func))
	{
		const bool			isX			= isDfdxFunc(m_definitions.func);
		const float			div			= isX ? float(result.getWidth()) : float(result.getHeight());
		const tcu::Vec4		scale		= isX ? xScale : yScale;
		tcu::Vec4			reference	= ((m_values.coordMax - m_values.coordMin) / div);
		const tcu::Vec4		opThreshold	= getDerivateThreshold(m_definitions.precision, m_values.coordMin, m_values.coordMax, reference);
		const tcu::Vec4		threshold	= max(surfaceThreshold, opThreshold);
		const int			numComps	= glu::getDataTypeFloatScalars(m_definitions.dataType);

		/* adjust the reference value for the correct dfdx or dfdy sample adjacency */
		reference = reference * scale;

		m_context.getTestContext().getLog()
			<< tcu::TestLog::Message
			<< "Verifying result image.\n"
			<< "\tValid derivative is " << LogVecComps(reference, numComps) << " with threshold " << LogVecComps(threshold, numComps)
			<< tcu::TestLog::EndMessage;

		// short circuit if result is strictly within the normal value error bounds.
		// This improves performance significantly.
		if (verifyConstantDerivate(m_context.getTestContext().getLog(), result, errorMask, m_definitions.dataType,
								   reference, threshold, m_values.derivScale, m_values.derivBias,
								   LOG_NOTHING))
		{
			m_context.getTestContext().getLog()
				<< tcu::TestLog::Message
				<< "No incorrect derivatives found, result valid."
				<< tcu::TestLog::EndMessage;

			return true;
		}

		// some pixels exceed error bounds calculated for normal values. Verify that these
		// potentially invalid pixels are in fact valid due to (for example) subnorm flushing.

		m_context.getTestContext().getLog()
			<< tcu::TestLog::Message
			<< "Initial verification failed, verifying image by calculating accurate error bounds for each result pixel.\n"
			<< "\tVerifying each result derivative is within its range of legal result values."
			<< tcu::TestLog::EndMessage;

		{
			const tcu::UVec2			viewportSize	(VIEWPORT_WIDTH, VIEWPORT_HEIGHT);
			const float					w				= float(viewportSize.x());
			const float					h				= float(viewportSize.y());
			const tcu::Vec4				valueRamp		= (m_values.coordMax - m_values.coordMin);
			Linear2DFunctionEvaluator	function;

			function.matrix.setRow(0, tcu::Vec3(valueRamp.x() / w, 0.0f, m_values.coordMin.x()));
			function.matrix.setRow(1, tcu::Vec3(0.0f, valueRamp.y() / h, m_values.coordMin.y()));
			function.matrix.setRow(2, tcu::Vec3(valueRamp.z() / w, valueRamp.z() / h, m_values.coordMin.z() + m_values.coordMin.z()) / 2.0f);
			function.matrix.setRow(3, tcu::Vec3(-valueRamp.w() / w, -valueRamp.w() / h, m_values.coordMax.w() + m_values.coordMax.w()) / 2.0f);

			return reverifyConstantDerivateWithFlushRelaxations(m_context.getTestContext().getLog(), result, errorMask,
																m_definitions.dataType, m_definitions.precision, m_values.derivScale,
																m_values.derivBias, surfaceThreshold, m_definitions.func,
																function);
		}
	}
	else
	{
		DE_ASSERT(isFwidthFunc(m_definitions.func));
		const float			w			= float(result.getWidth());
		const float			h			= float(result.getHeight());

		const tcu::Vec4		dx			= ((m_values.coordMax - m_values.coordMin) / w) * xScale;
		const tcu::Vec4		dy			= ((m_values.coordMax - m_values.coordMin) / h) * yScale;
		const tcu::Vec4		reference	= tcu::abs(dx) + tcu::abs(dy);
		const tcu::Vec4		dxThreshold	= getDerivateThreshold(m_definitions.precision, m_values.coordMin*xScale, m_values.coordMax*xScale, dx);
		const tcu::Vec4		dyThreshold	= getDerivateThreshold(m_definitions.precision, m_values.coordMin*yScale, m_values.coordMax*yScale, dy);
		const tcu::Vec4		threshold	= max(surfaceThreshold, max(dxThreshold, dyThreshold));

		return verifyConstantDerivate(m_context.getTestContext().getLog(), result, errorMask, m_definitions.dataType,
									  reference, threshold, m_values.derivScale, m_values.derivBias);
	}
}